

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_string_utf8_index_set(sexp ctx,sexp self,sexp_sint_t n,sexp str,sexp i,sexp ch)

{
  undefined1 auVar1 [16];
  sexp psVar2;
  sexp in_RCX;
  sexp in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  char *in_R8;
  sexp in_R9;
  sexp unaff_retaddr;
  sexp off;
  sexp in_stack_00000040;
  sexp in_stack_fffffffffffffff8;
  
  if ((((ulong)in_RCX & 3) == 0) && (in_RCX->tag == 9)) {
    if (((ulong)in_R8 & 1) == 1) {
      if (((ulong)in_R9 & 0xff) == 0x1e) {
        if ((in_RCX->field_0x5 & 1) == 0) {
          psVar2 = sexp_string_index_to_cursor
                             (off,unaff_retaddr,(sexp_sint_t)in_stack_fffffffffffffff8,in_RDI,in_RSI
                             );
          if ((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 0x13)) {
            auVar1._8_8_ = (long)psVar2 >> 0x3f;
            auVar1._0_8_ = (ulong)psVar2 & 0xfffffffffffffffd;
            if (SUB168(auVar1 / SEXT816(8),0) < (in_RCX->value).uvector.length) {
              sexp_string_utf8_set(unaff_retaddr,in_stack_fffffffffffffff8,in_RDI,in_RSI);
              psVar2 = (sexp)&DAT_0000043e;
            }
            else {
              psVar2 = sexp_user_exception(in_stack_00000040,ctx,(char *)self,(sexp)n);
            }
          }
        }
        else {
          psVar2 = sexp_xtype_exception(in_RDX,in_RCX,in_R8,in_R9);
        }
      }
      else {
        psVar2 = sexp_type_exception(in_RDX,in_RCX,(sexp_uint_t)in_R8,in_R9);
      }
    }
    else {
      psVar2 = sexp_type_exception(in_RDX,in_RCX,(sexp_uint_t)in_R8,in_R9);
    }
  }
  else {
    psVar2 = sexp_type_exception(in_RDX,in_RCX,(sexp_uint_t)in_R8,in_R9);
  }
  return psVar2;
}

Assistant:

sexp sexp_string_utf8_index_set (sexp ctx, sexp self, sexp_sint_t n, sexp str, sexp i, sexp ch) {
  sexp off;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, i);
  sexp_assert_type(ctx, sexp_charp, SEXP_CHAR, ch);
  if (sexp_immutablep(str))
    return sexp_xtype_exception(ctx, self, "string-set!: immutable string", str);
  off = sexp_string_index_to_cursor(ctx, self, n, str, i);
  if (sexp_exceptionp(off)) return off;
  if (sexp_unbox_string_cursor(off) >= (sexp_sint_t)sexp_string_size(str))
    return sexp_user_exception(ctx, self, "string-set!: index out of range", i);
  sexp_string_utf8_set(ctx, str, off, ch);
  return SEXP_VOID;
}